

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O0

void __thiscall
Rml::ElementAnimation::ElementAnimation
          (ElementAnimation *this,PropertyId property_id,ElementAnimationOrigin origin,
          Property *current_value,Element *element,double start_world_time,float duration,
          int num_iterations,bool alternate_direction)

{
  long lVar1;
  double element_00;
  Element *in_property;
  undefined8 uVar2;
  Tween local_80 [2];
  String local_60;
  undefined1 local_39;
  int local_38;
  float fStack_34;
  bool alternate_direction_local;
  int num_iterations_local;
  float duration_local;
  double start_world_time_local;
  Element *element_local;
  Property *current_value_local;
  ElementAnimationOrigin origin_local;
  ElementAnimation *pEStack_10;
  PropertyId property_id_local;
  ElementAnimation *this_local;
  
  local_39 = alternate_direction;
  this->property_id = property_id;
  this->duration = duration;
  this->num_iterations = num_iterations;
  this->alternate_direction = alternate_direction;
  local_38 = num_iterations;
  fStack_34 = duration;
  _num_iterations_local = start_world_time;
  start_world_time_local = (double)element;
  element_local = (Element *)current_value;
  current_value_local._6_1_ = origin;
  current_value_local._7_1_ = property_id;
  pEStack_10 = this;
  ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::vector(&this->keys);
  this->last_update_world_time = _num_iterations_local;
  this->time_since_iteration_start = 0.0;
  this->current_iteration = 0;
  this->reverse_direction = false;
  this->animation_complete = false;
  this->origin = current_value_local._6_1_;
  lVar1._0_4_ = element_local->num_non_dom_children;
  lVar1._4_4_ = element_local->clip_area;
  if (lVar1 == 0) {
    Property::ToString_abi_cxx11_(&local_60,(Property *)element_local);
    uVar2 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,
                 "Property in animation key did not have a definition (while adding key \'%s\').",
                 uVar2);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  in_property = element_local;
  element_00 = start_world_time_local;
  Tween::Tween(local_80,Linear,Out);
  InternalAddKey(this,0.0,(Property *)in_property,(Element *)element_00,local_80[0]);
  return;
}

Assistant:

ElementAnimation::ElementAnimation(PropertyId property_id, ElementAnimationOrigin origin, const Property& current_value, Element& element,
	double start_world_time, float duration, int num_iterations, bool alternate_direction) :
	property_id(property_id), duration(duration), num_iterations(num_iterations), alternate_direction(alternate_direction),
	last_update_world_time(start_world_time), origin(origin)
{
	if (!current_value.definition)
	{
		Log::Message(Log::LT_WARNING, "Property in animation key did not have a definition (while adding key '%s').",
			current_value.ToString().c_str());
	}
	InternalAddKey(0.0f, current_value, element, Tween{});
}